

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QWindow * __thiscall QFbScreen::topWindow(QFbScreen *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWindow *unaff_RBX;
  long lVar4;
  
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      QPlatformWindow::window();
      iVar3 = QWindow::type();
      if (iVar3 == 1) {
LAB_0011d0a3:
        unaff_RBX = (QWindow *)QPlatformWindow::window();
        bVar2 = false;
      }
      else {
        QPlatformWindow::window();
        iVar3 = QWindow::type();
        bVar2 = true;
        if (iVar3 == 3) goto LAB_0011d0a3;
      }
      if (!bVar2) {
        return unaff_RBX;
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  return (QWindow *)0x0;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }